

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_binbuf.c
# Opt level: O0

void binbuf_savetext(_binbuf *bfrom,_binbuf *bto)

{
  int iVar1;
  t_atom *ptVar2;
  char *pcVar3;
  char local_428 [8];
  char buf [1001];
  t_atom at;
  t_atom *ap;
  int n;
  int k;
  _binbuf *bto_local;
  _binbuf *bfrom_local;
  
  iVar1 = binbuf_getnatom(bfrom);
  ptVar2 = binbuf_getvec(bfrom);
  ap._4_4_ = 0;
  do {
    if (iVar1 <= ap._4_4_) {
      binbuf_addsemi(bto);
      return;
    }
    if (ptVar2[ap._4_4_].a_type == A_FLOAT) {
LAB_0019dac1:
      binbuf_add(bto,1,ptVar2 + ap._4_4_);
    }
    else {
      if (ptVar2[ap._4_4_].a_type == A_SYMBOL) {
        pcVar3 = strchr((ptVar2[ap._4_4_].a_w.w_symbol)->s_name,0x3b);
        if (pcVar3 == (char *)0x0) {
          pcVar3 = strchr((ptVar2[ap._4_4_].a_w.w_symbol)->s_name,0x2c);
          if (pcVar3 == (char *)0x0) {
            pcVar3 = strchr((ptVar2[ap._4_4_].a_w.w_symbol)->s_name,0x24);
            if (pcVar3 == (char *)0x0) goto LAB_0019dac1;
          }
        }
      }
      atom_string(ptVar2 + ap._4_4_,local_428,1000);
      stack0xffffffffffffffc8 = 2;
      gensym(local_428);
      binbuf_add(bto,1,(t_atom *)(buf + 1000));
    }
    ap._4_4_ = ap._4_4_ + 1;
  } while( true );
}

Assistant:

void binbuf_savetext(const t_binbuf *bfrom, t_binbuf *bto)
{
    int k, n = binbuf_getnatom(bfrom);
    const t_atom *ap = binbuf_getvec(bfrom);
    t_atom at;
    for (k = 0; k < n; k++)
    {
        if (ap[k].a_type == A_FLOAT ||
            (ap[k].a_type == A_SYMBOL &&
                !strchr(ap[k].a_w.w_symbol->s_name, ';') &&
                !strchr(ap[k].a_w.w_symbol->s_name, ',') &&
                !strchr(ap[k].a_w.w_symbol->s_name, '$')))
                    binbuf_add(bto, 1, &ap[k]);
        else
        {
            char buf[MAXPDSTRING+1];
            atom_string(&ap[k], buf, MAXPDSTRING);
            SETSYMBOL(&at, gensym(buf));
            binbuf_add(bto, 1, &at);
        }
    }
    binbuf_addsemi(bto);
}